

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O3

void __thiscall IF97::Region3::Region3(Region3 *this)

{
  iterator iVar1;
  iterator iVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  
  memset(this,0,0x138);
  this->T_star = 1000.0;
  this->p_star = 1.0;
  if (DAT_0012bc10 != reg3rdata) {
    lVar5 = 8;
    uVar6 = 0;
    lVar3 = reg3rdata;
    do {
      iVar1._M_current =
           (this->nr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->nr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->nr,iVar1,
                   (double *)(lVar3 + lVar5));
        lVar3 = reg3rdata;
      }
      else {
        *iVar1._M_current = *(double *)(lVar3 + lVar5);
        (this->nr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      piVar4 = (int *)(lVar3 + lVar5 + -8);
      iVar2._M_current =
           (this->Ir).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar2._M_current ==
          (this->Ir).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)this,iVar2,piVar4);
        lVar3 = reg3rdata;
      }
      else {
        *iVar2._M_current = *piVar4;
        (this->Ir).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      piVar4 = (int *)(lVar3 + lVar5 + -4);
      iVar2._M_current =
           (this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar2._M_current ==
          (this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->Jr,iVar2,piVar4);
        lVar3 = reg3rdata;
      }
      else {
        *iVar2._M_current = *piVar4;
        (this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)(DAT_0012bc10 - lVar3 >> 4));
  }
  if (DAT_0012bb38 != Hrdata) {
    lVar5 = 8;
    uVar6 = 0;
    lVar3 = Hrdata;
    do {
      iVar1._M_current =
           (this->munr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->munr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->munr,iVar1,
                   (double *)(lVar3 + lVar5));
        lVar3 = Hrdata;
      }
      else {
        *iVar1._M_current = *(double *)(lVar3 + lVar5);
        (this->munr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      piVar4 = (int *)(lVar3 + lVar5 + -8);
      iVar2._M_current =
           (this->muIr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->muIr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->muIr,iVar2,piVar4);
        lVar3 = Hrdata;
      }
      else {
        *iVar2._M_current = *piVar4;
        (this->muIr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      piVar4 = (int *)(lVar3 + lVar5 + -4);
      iVar2._M_current =
           (this->muJr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->muJr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->muJr,iVar2,piVar4);
        lVar3 = Hrdata;
      }
      else {
        *iVar2._M_current = *piVar4;
        (this->muJr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)(DAT_0012bb38 - lVar3 >> 4));
  }
  if (DAT_0012bb50 != H0data) {
    lVar5 = 8;
    uVar6 = 0;
    lVar3 = H0data;
    do {
      iVar1._M_current =
           (this->mun0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->mun0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->mun0,iVar1,
                   (double *)(lVar3 + lVar5));
        lVar3 = H0data;
      }
      else {
        *iVar1._M_current = *(double *)(lVar3 + lVar5);
        (this->mun0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      piVar4 = (int *)(lVar3 + lVar5 + -8);
      iVar2._M_current =
           (this->muJ0).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->muJ0).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->muJ0,iVar2,piVar4);
        lVar3 = H0data;
      }
      else {
        *iVar2._M_current = *piVar4;
        (this->muJ0).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)(DAT_0012bb50 - lVar3 >> 4));
  }
  if (DAT_0012bb68 != Lrdata) {
    lVar5 = 8;
    uVar6 = 0;
    lVar3 = Lrdata;
    do {
      iVar1._M_current =
           (this->lamnr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->lamnr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->lamnr,iVar1,
                   (double *)(lVar3 + lVar5));
        lVar3 = Lrdata;
      }
      else {
        *iVar1._M_current = *(double *)(lVar3 + lVar5);
        (this->lamnr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      piVar4 = (int *)(lVar3 + lVar5 + -8);
      iVar2._M_current =
           (this->lamIr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->lamIr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->lamIr,iVar2,piVar4);
        lVar3 = Lrdata;
      }
      else {
        *iVar2._M_current = *piVar4;
        (this->lamIr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      piVar4 = (int *)(lVar3 + lVar5 + -4);
      iVar2._M_current =
           (this->lamJr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->lamJr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->lamJr,iVar2,piVar4);
        lVar3 = Lrdata;
      }
      else {
        *iVar2._M_current = *piVar4;
        (this->lamJr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)(DAT_0012bb68 - lVar3 >> 4));
  }
  if (DAT_0012bb80 != L0data) {
    lVar5 = 8;
    uVar6 = 0;
    lVar3 = L0data;
    do {
      iVar1._M_current =
           (this->lamn0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->lamn0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->lamn0,iVar1,
                   (double *)(lVar3 + lVar5));
        lVar3 = L0data;
      }
      else {
        *iVar1._M_current = *(double *)(lVar3 + lVar5);
        (this->lamn0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      piVar4 = (int *)(lVar3 + lVar5 + -8);
      iVar2._M_current =
           (this->lamJ0).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->lamJ0).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->lamJ0,iVar2,piVar4);
        lVar3 = L0data;
      }
      else {
        *iVar2._M_current = *piVar4;
        (this->lamJ0).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)(DAT_0012bb80 - lVar3 >> 4));
  }
  this->R = 0.461526;
  return;
}

Assistant:

Region3() : T_star(1000), p_star(1*p_fact) {
            for (std::size_t i = 0; i < reg3rdata.size(); ++i){
                nr.push_back(reg3rdata[i].n);
                Ir.push_back(reg3rdata[i].I);
                Jr.push_back(reg3rdata[i].J);
            }
            for (std::size_t i = 0; i < Hrdata.size(); ++i){
                munr.push_back(Hrdata[i].n);
                muIr.push_back(Hrdata[i].I);
                muJr.push_back(Hrdata[i].J);
            }
            for (std::size_t i = 0; i < H0data.size(); ++i){
                mun0.push_back(H0data[i].n);
                muJ0.push_back(H0data[i].J);
            }
            for (std::size_t i = 0; i < Lrdata.size(); ++i){
                lamnr.push_back(Lrdata[i].n);
                lamIr.push_back(Lrdata[i].I);
                lamJr.push_back(Lrdata[i].J);
            }
            for (std::size_t i = 0; i < L0data.size(); ++i){
                lamn0.push_back(L0data[i].n);
                lamJ0.push_back(L0data[i].J);
            }
            R = Rgas;
        }